

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O1

void __thiscall
Professor::Professor
          (Professor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data)

{
  char *pcVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_38 = (string *)&this->name;
  local_58 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_58;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_40 = (string *)&this->surname;
  local_60 = &(this->surname).field_2;
  (this->surname)._M_dataplus._M_p = (pointer)local_60;
  (this->surname)._M_string_length = 0;
  (this->surname).field_2._M_local_buf[0] = '\0';
  local_48 = (string *)&this->middle_name;
  local_68 = &(this->middle_name).field_2;
  (this->middle_name)._M_dataplus._M_p = (pointer)local_68;
  (this->middle_name)._M_string_length = 0;
  (this->middle_name).field_2._M_local_buf[0] = '\0';
  local_50 = &this->link;
  local_70 = &(this->link).field_2;
  (this->link)._M_dataplus._M_p = (pointer)local_70;
  (this->link)._M_string_length = 0;
  (this->link).field_2._M_local_buf[0] = '\0';
  pcVar1 = (((data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  piVar3 = __errno_location();
  iVar6 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(pcVar1,&local_78,10);
  if (local_78 == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_00112d2c:
    std::__throw_out_of_range("stoi");
LAB_00112d38:
    std::__throw_invalid_argument("stoi");
LAB_00112d44:
    std::__throw_out_of_range("stoi");
LAB_00112d50:
    std::__throw_invalid_argument("stoi");
LAB_00112d5c:
    std::__throw_out_of_range("stoi");
LAB_00112d68:
    std::__throw_invalid_argument("stoi");
LAB_00112d74:
    std::__throw_out_of_range("stoi");
LAB_00112d80:
    std::__throw_invalid_argument("stoi");
LAB_00112d8c:
    iVar6 = (int)&local_78;
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_00112d2c;
    if (*piVar3 == 0) {
      *piVar3 = iVar6;
    }
    this->prep_id = (int)lVar4;
    std::__cxx11::string::_M_assign(local_38);
    std::__cxx11::string::_M_assign(local_40);
    std::__cxx11::string::_M_assign(local_48);
    pcVar1 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    iVar6 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar1,&local_78,10);
    if (local_78 == pcVar1) goto LAB_00112d38;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_00112d44;
    if (*piVar3 == 0) {
      *piVar3 = iVar6;
    }
    this->knowledge = (double)(int)lVar4;
    pcVar1 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
    iVar6 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar1,&local_78,10);
    if (local_78 == pcVar1) goto LAB_00112d50;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_00112d5c;
    if (*piVar3 == 0) {
      *piVar3 = iVar6;
    }
    this->skill = (double)(int)lVar4;
    pcVar1 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
    iVar6 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar1,&local_78,10);
    if (local_78 == pcVar1) goto LAB_00112d68;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_00112d74;
    if (*piVar3 == 0) {
      *piVar3 = iVar6;
    }
    this->social = (double)(int)lVar4;
    pcVar1 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
    iVar6 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar1,&local_78,10);
    if (local_78 == pcVar1) goto LAB_00112d80;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_00112d8c;
    if (*piVar3 == 0) {
      *piVar3 = iVar6;
    }
    this->loyality = (double)(int)lVar4;
    pcVar1 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
    iVar6 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar1,&local_78,10);
    if (local_78 != pcVar1) {
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar6;
        }
        this->total = (double)(int)lVar4;
        std::__cxx11::string::_M_replace
                  ((ulong)local_50,0,(char *)(this->link)._M_string_length,0x11d0e1);
        return;
      }
      goto LAB_00112da4;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00112da4:
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar6;
  }
  plVar2 = (long *)(local_50->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar2 != local_70) {
    operator_delete(plVar2,local_70->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(long **)local_48 != local_68) {
    operator_delete(*(long **)local_48,local_68->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(long **)local_40 != local_60) {
    operator_delete(*(long **)local_40,local_60->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(long **)local_38 != local_58) {
    operator_delete(*(long **)local_38,local_58->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

Professor(std::vector<std::string> data) {
        prep_id = std::stoi(data[0]);
        name = data[1];
        surname = data[2];
        middle_name = data[3];
        knowledge = std::stoi(data[4]);
        skill = std::stoi(data[5]);
        social = std::stoi(data[6]);
        loyality = std::stoi(data[7]);
        total = std::stoi(data[8]);
        link = "";

    }